

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QSet<QWidget_*> * __thiscall QSet<QWidget_*>::unite(QSet<QWidget_*> *this,QSet<QWidget_*> *other)

{
  Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *d;
  Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *pDVar1;
  Entry *pEVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QHashDummyValue local_59;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (other->q_hash).d;
  if (pDVar1 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) {
    pDVar1 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
    uVar3 = 0;
    if ((this->q_hash).d == (Data *)0x0) goto LAB_003fd415;
LAB_003fd336:
    if (pDVar1 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 && uVar3 == 0)
    goto LAB_003fd415;
  }
  else {
    d = (this->q_hash).d;
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) {
        if (0 < (long)pDVar1->size) {
          (this->q_hash).d = pDVar1;
          (other->q_hash).d = (Data *)0x0;
          d = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
          uVar3 = 0;
LAB_003fd35b:
          if (d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 && uVar3 == 0)
          goto LAB_003fd415;
          goto LAB_003fd490;
        }
      }
      else if ((long)d->size < (long)pDVar1->size) {
        (this->q_hash).d = pDVar1;
        (other->q_hash).d = d;
        if ((uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
          if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
            d = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::detached(d);
            (other->q_hash).d = d;
          }
          if (d->spans->offsets[0] == 0xff) {
            uVar3 = 1;
            do {
              uVar4 = uVar3;
              if (d->numBuckets == uVar4) {
                d = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
                uVar4 = 0;
                break;
              }
              uVar3 = uVar4 + 1;
            } while (d->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
            if (d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 && uVar4 == 0)
            goto LAB_003fd415;
          }
          else {
            uVar4 = 0;
          }
          do {
            pEVar2 = d->spans[uVar4 >> 7].entries + d->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]
            ;
            local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QHash<QWidget*,QHashDummyValue>::tryEmplace_impl<QWidget*const&>
                      ((TryEmplaceResult *)local_58,(QHash<QWidget*,QHashDummyValue> *)this,
                       (QWidget **)pEVar2);
            if (local_58[0x10] == false) {
              *(undefined8 *)
               (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
               [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                [(uint)local_58._8_8_ & 0x7f]].storage.data = *(undefined8 *)(pEVar2->storage).data;
            }
            do {
              if (d->numBuckets - 1 == uVar4) {
                d = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
                uVar4 = 0;
                break;
              }
              uVar4 = uVar4 + 1;
            } while (d->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
          } while ((d != (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) ||
                  (uVar4 != 0));
          goto LAB_003fd415;
        }
        if (d->spans->offsets[0] == 0xff) {
          uVar4 = 1;
          do {
            uVar3 = uVar4;
            if (d->numBuckets == uVar3) {
              d = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
              uVar3 = 0;
              break;
            }
            uVar4 = uVar3 + 1;
          } while (d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
          goto LAB_003fd35b;
        }
        uVar3 = 0;
LAB_003fd490:
        do {
          pEVar2 = d->spans[uVar3 >> 7].entries + d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f];
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QHash<QWidget*,QHashDummyValue>::tryEmplace_impl<QWidget*const&>
                    ((TryEmplaceResult *)local_58,(QHash<QWidget*,QHashDummyValue> *)this,
                     (QWidget **)pEVar2);
          if (local_58[0x10] == false) {
            *(undefined8 *)
             (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
             [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
              [(uint)local_58._8_8_ & 0x7f]].storage.data = *(undefined8 *)(pEVar2->storage).data;
          }
          do {
            if (d->numBuckets - 1 == uVar3) {
              d = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
              uVar3 = 0;
              break;
            }
            uVar3 = uVar3 + 1;
          } while (d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
        } while ((d != (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) || (uVar3 != 0)
                );
        goto LAB_003fd415;
      }
    }
    if (d == pDVar1) goto LAB_003fd415;
    if (pDVar1->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        uVar3 = uVar4;
        if (pDVar1->numBuckets == uVar3) {
          pDVar1 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
          uVar3 = 0;
          break;
        }
        uVar4 = uVar3 + 1;
      } while (pDVar1->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_003fd336;
    }
    uVar3 = 0;
  }
  do {
    local_58._0_8_ =
         *(undefined8 *)
          pDVar1->spans[uVar3 >> 7].entries[pDVar1->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].
          storage.data;
    QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QWidget*,QHashDummyValue> *)this,(QWidget **)local_58,&local_59);
    do {
      if (pDVar1->numBuckets - 1 == uVar3) {
        uVar3 = 0;
        pDVar1 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar1->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while (uVar3 != 0 || pDVar1 != (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0);
LAB_003fd415:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

Q_INLINE_TEMPLATE auto QSet<T>::unite(QSet &&other) -> QSet&
{
    if (other.isDetached() && size() < other.size()) {

        // We can change the state of `other`, so take the smaller *this and
        // insert it into the larger `other`, making sure we take equivalent
        // elements from *this:

        swap(other);

        // Now: iterate over `other`, insert into *this, making sure we take
        //      equivalent elements from `other`:

        if (other.isDetached()) { // can move elements from `other`
            for (auto &e : other)
                _emplace_or_overwrite(std::move(e));
        } else { // need to copy elements from `other`
            for (const auto &e : std::as_const(other))
                _emplace_or_overwrite(e);
        }

        return *this;
    }

    // in all other cases, the lvalue overload is not worse:
    return unite(other);
}